

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Metadpy_nuke(void)

{
  metadpy *pmVar1;
  metadpy *m;
  
  pmVar1 = Metadpy;
  if (((byte)Metadpy->field_0x68 >> 2 & 1) != 0) {
    XCloseDisplay(Metadpy->dpy);
    pmVar1->dpy = (Display *)0x0;
    pmVar1->field_0x68 = pmVar1->field_0x68 & 0xfb;
  }
  return 0;
}

Assistant:

static errr Metadpy_nuke(void)
{
	metadpy *m = Metadpy;


	/* If required, Free the Display */
	if (m->nuke) {
		/* Close the Display */
		XCloseDisplay(m->dpy);

		/* Forget the Display */
		m->dpy = (Display*)(NULL);

		/* Do not nuke it again */
		m->nuke = 0;
	}

	/* Return Success */
	return (0);
}